

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::ScanArena(Recycler *this,ArenaData *alloc,bool background)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  BigBlock *pBVar3;
  size_t sVar4;
  size_t sVar5;
  ArenaMemoryBlock *memoryBlocks;
  size_t sVar6;
  size_t scanRootBytes;
  bool background_local;
  ArenaData *alloc_local;
  Recycler *this_local;
  
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::Phases::IsEnabled(&pCVar2->Trace,MarkPhase);
  if (bVar1) {
LAB_0099a9bf:
    this->forceTraceMark = true;
    Output::Print(L"Scanning Guest Arena %p: ",alloc);
  }
  else {
    pCVar2 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Trace,FindRootPhase);
    if (bVar1) goto LAB_0099a9bf;
  }
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::BeginDumpObject(this->objectGraphDumper,L"Guest Arena",alloc);
  }
  pBVar3 = ArenaData::GetBigBlocks(alloc,background);
  sVar4 = TryMarkBigBlockList(this,pBVar3);
  pBVar3 = ArenaData::GetFullBlocks(alloc);
  sVar5 = TryMarkBigBlockList(this,pBVar3);
  memoryBlocks = ArenaData::GetMemoryBlocks(alloc);
  sVar6 = TryMarkArenaMemoryBlockList(this,memoryBlocks);
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::EndDumpObject(this->objectGraphDumper);
  }
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::Phases::IsEnabled(&pCVar2->Trace,MarkPhase);
  if (!bVar1) {
    pCVar2 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Trace,FindRootPhase);
    if (!bVar1) goto LAB_0099aaef;
  }
  this->forceTraceMark = false;
  Output::Print(L"\n");
  Output::Flush();
LAB_0099aaef:
  if ((background) ||
     (pCVar2 = GetRecyclerFlagsTable(this), (pCVar2->RecyclerProtectPagesOnRescan & 1U) == 0)) {
    ArenaData::SetLockBlockList(alloc,false);
  }
  return sVar6 + sVar5 + sVar4;
}

Assistant:

size_t
Recycler::ScanArena(ArenaData * alloc, bool background)
{
#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = true;
        Output::Print(_u("Scanning Guest Arena %p: "), alloc);
    }
#endif

    size_t scanRootBytes = 0;
    BEGIN_DUMP_OBJECT_ADDRESS(_u("Guest Arena"), alloc);

#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
// The new write watch batching logic broke the write watch handling here.
// For now, just disable write watch for guest arenas.
// TODO: Re-enable this in the future.
#if FALSE
    // Note, guest arenas are allocated out of the large block page allocator.
    bool writeWatch = alloc->GetPageAllocator() == &this->recyclerLargeBlockPageAllocator;

    // Only use write watch when we are doing rescan (Partial collect or finish concurrent)
    if (writeWatch && this->collectionState == CollectionStateRescanFindRoots)
    {
        scanRootBytes += TryMarkBigBlockListWithWriteWatch(alloc->GetBigBlocks(background));
        scanRootBytes += TryMarkBigBlockListWithWriteWatch(alloc->GetFullBlocks());
    }
    else
#endif
#endif
    {
        scanRootBytes += TryMarkBigBlockList(alloc->GetBigBlocks(background));
        scanRootBytes += TryMarkBigBlockList(alloc->GetFullBlocks());
    }
    scanRootBytes += TryMarkArenaMemoryBlockList(alloc->GetMemoryBlocks());
    END_DUMP_OBJECT(this);
#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = false;
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    // The arena has been scanned so the full blocks can be rearranged at this point
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (background || !GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan)
#endif
    {
        alloc->SetLockBlockList(false);
    }

    return scanRootBytes;
}